

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setCurrency(DecimalFormat *this,char16_t *theCurrency,UErrorCode *ec)

{
  DecimalFormatProperties *pDVar1;
  UBool UVar2;
  bool bVar3;
  UErrorCode localStatus;
  CurrencyUnit currencyUnit;
  ConstChar16Ptr local_88;
  char16_t *local_80;
  UErrorCode local_6c;
  CurrencyUnit local_68;
  CurrencyUnit local_48;
  
  local_88.p_ = theCurrency;
  CurrencyUnit::CurrencyUnit(&local_68,&local_88,ec);
  local_80 = local_88.p_;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((this->fields->properties).
          super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->currency).
        fNull == false) {
      CurrencyUnit::CurrencyUnit
                (&local_48,
                 &(((this->fields->properties).
                    super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                  currency).fValue);
      UVar2 = MeasureUnit::operator==(&local_48.super_MeasureUnit,(UObject *)&local_68);
      bVar3 = UVar2 != '\0';
      CurrencyUnit::~CurrencyUnit(&local_48);
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) {
      NumberFormat::setCurrency(&this->super_NumberFormat,theCurrency,ec);
      pDVar1 = (this->fields->properties).
               super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
      CurrencyUnit::operator=(&(pDVar1->currency).fValue,&local_68);
      (pDVar1->currency).fNull = false;
      local_6c = U_ZERO_ERROR;
      touch(this,&local_6c);
    }
  }
  CurrencyUnit::~CurrencyUnit(&local_68);
  return;
}

Assistant:

void DecimalFormat::setCurrency(const char16_t* theCurrency, UErrorCode& ec) {
    CurrencyUnit currencyUnit(theCurrency, ec);
    if (U_FAILURE(ec)) { return; }
    if (!fields->properties->currency.isNull() && fields->properties->currency.getNoError() == currencyUnit) {
        return;
    }
    NumberFormat::setCurrency(theCurrency, ec); // to set field for compatibility
    fields->properties->currency = currencyUnit;
    // TODO: Set values in fields->symbols, too?
    touchNoError();
}